

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp.c
# Opt level: O2

LIBSSH2_CHANNEL *
scp_send(LIBSSH2_SESSION *session,char *path,int mode,libssh2_int64_t size,time_t mtime,time_t atime
        )

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uchar *puVar4;
  LIBSSH2_CHANNEL *channel;
  ssize_t sVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  
  switch(session->scpSend_state) {
  case libssh2_NB_state_idle:
    break;
  default:
    iVar1 = session->scpSend_state - libssh2_NB_state_sent2;
    if (atime == 0 && mtime == 0) {
      switch(iVar1) {
      case 0:
        goto switchD_0011f06a_caseD_0;
      default:
        goto switchD_0011f043_default;
      case 2:
        goto switchD_0011f043_caseD_2;
      case 3:
        goto switchD_0011f043_caseD_3;
      case 4:
        goto switchD_0011f043_caseD_4;
      }
    }
    switch(iVar1) {
    case 0:
      goto switchD_0011f043_caseD_0;
    case 1:
      goto switchD_0011f043_caseD_1;
    case 2:
      goto switchD_0011f043_caseD_2;
    case 3:
switchD_0011f043_caseD_3:
      sVar7 = session->scpSend_response_len;
      goto LAB_0011f315;
    case 4:
      goto switchD_0011f043_caseD_4;
    }
    goto switchD_0011f043_default;
  case libssh2_NB_state_created:
    goto switchD_0011ef59_caseD_2;
  case libssh2_NB_state_sent:
    channel = session->scpSend_channel;
    goto LAB_0011f0fc;
  case libssh2_NB_state_sent1:
    goto switchD_0011ef59_caseD_4;
  }
  sVar3 = strlen(path);
  sVar7 = ((ulong)(atime == 0 && mtime == 0) ^ 0xb) + sVar3 * 3;
  session->scpSend_command_len = sVar7;
  puVar4 = (uchar *)(*session->alloc)(sVar7,&session->abstract);
  session->scpSend_command = puVar4;
  if (puVar4 == (uchar *)0x0) {
    pcVar8 = "Unable to allocate a command buffer for SCP session";
    iVar1 = -6;
    goto LAB_0011f377;
  }
  pcVar8 = "p";
  if (atime == 0 && mtime == 0) {
    pcVar8 = "";
  }
  snprintf((char *)puVar4,session->scpSend_command_len,"scp -%st ",pcVar8);
  puVar4 = session->scpSend_command;
  sVar3 = strlen((char *)puVar4);
  if ((session->flag).quote_paths == 0) {
    sVar7 = strlen(path);
    memcpy(puVar4 + sVar3,path,sVar7);
  }
  else {
    sVar7 = shell_quotearg(path,puVar4 + sVar3,session->scpSend_command_len - sVar3);
  }
  session->scpSend_command_len = sVar7 + sVar3;
  session->scpSend_state = libssh2_NB_state_created;
switchD_0011ef59_caseD_2:
  channel = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
  session->scpSend_channel = channel;
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar1 = libssh2_session_last_errno(session);
    if (iVar1 != -0x25) {
      (*session->free)(session->scpSend_command,&session->abstract);
      session->scpSend_command = (uchar *)0x0;
      goto LAB_0011f449;
    }
    pcVar8 = "Would block starting up channel";
  }
  else {
    session->scpSend_state = libssh2_NB_state_sent;
LAB_0011f0fc:
    iVar1 = _libssh2_channel_process_startup
                      (channel,"exec",4,(char *)session->scpSend_command,
                       session->scpSend_command_len);
    if (iVar1 == 0) {
      (*session->free)(session->scpSend_command,&session->abstract);
      session->scpSend_command = (uchar *)0x0;
      session->scpSend_state = libssh2_NB_state_sent1;
switchD_0011ef59_caseD_4:
      puVar4 = session->scpSend_response;
      sVar5 = _libssh2_channel_read(session->scpSend_channel,0,(char *)puVar4,1);
      iVar1 = (int)sVar5;
      if (iVar1 == -0x25) {
        pcVar8 = "Would block waiting for response from remote";
      }
      else {
        if (iVar1 < 0) {
LAB_0011f2ac:
          pcVar8 = "SCP failure";
          goto LAB_0011f411;
        }
        if (iVar1 == 0) {
LAB_0011f3f4:
          iVar1 = libssh2_channel_eof(session->scpSend_channel);
          if (iVar1 == 0) {
LAB_0011f468:
            return session->scpSend_channel;
          }
          pcVar8 = "Unexpected channel close";
          goto LAB_0011f40b;
        }
        if (*puVar4 != '\0') {
LAB_0011f3eb:
          pcVar8 = "Invalid ACK response from remote";
          goto LAB_0011f40b;
        }
        if (atime == 0 && mtime == 0) {
switchD_0011f06a_caseD_0:
          session->scpSend_state = libssh2_NB_state_sent4;
switchD_0011f043_caseD_2:
          pcVar6 = strrchr(path,0x2f);
          pcVar8 = pcVar6 + 1;
          if (pcVar6 == (char *)0x0) {
            pcVar8 = path;
          }
          iVar1 = snprintf((char *)session->scpSend_response,0x100,"C0%o %lld %s\n",
                           (ulong)(uint)mode,size,pcVar8);
          sVar7 = (size_t)iVar1;
          session->scpSend_response_len = sVar7;
          session->scpSend_state = libssh2_NB_state_sent5;
LAB_0011f315:
          sVar5 = _libssh2_channel_write(session->scpSend_channel,0,session->scpSend_response,sVar7)
          ;
          if ((int)sVar5 != -0x25) {
            if ((int)sVar5 != (int)session->scpSend_response_len) {
              pcVar8 = "Unable to send core file data for SCP file";
LAB_0011f481:
              iVar1 = -7;
              goto LAB_0011f411;
            }
            session->scpSend_state = libssh2_NB_state_sent6;
switchD_0011f043_caseD_4:
            sVar5 = _libssh2_channel_read
                              (session->scpSend_channel,0,(char *)session->scpSend_response,1);
            iVar1 = (int)sVar5;
            if (iVar1 == -0x25) goto LAB_0011f36e;
            if (-1 < iVar1) {
              if (iVar1 != 0) {
                if (session->scpSend_response[0] == '\0') {
switchD_0011f043_default:
                  session->scpSend_state = libssh2_NB_state_idle;
                  goto LAB_0011f468;
                }
                sVar7 = _libssh2_channel_packet_data_len(session->scpSend_channel,0);
                pcVar8 = (char *)(*session->alloc)(sVar7 + 1,&session->abstract);
                if (pcVar8 != (char *)0x0) {
                  sVar5 = _libssh2_channel_read(session->scpSend_channel,0,pcVar8,sVar7);
                  if (0 < (int)sVar5) {
                    pcVar8[sVar7] = '\0';
                  }
                  (*session->free)(pcVar8,&session->abstract);
                  pcVar8 = "failed to send file";
                  goto LAB_0011f40b;
                }
                pcVar8 = "failed to get memory";
                iVar1 = -6;
                goto LAB_0011f411;
              }
              goto LAB_0011f3f4;
            }
            goto LAB_0011f3eb;
          }
          pcVar8 = "Would block send core file data for SCP file";
        }
        else {
          iVar1 = snprintf((char *)puVar4,0x100,"T%ld 0 %ld 0\n",mtime,atime);
          session->scpSend_response_len = (long)iVar1;
          session->scpSend_state = libssh2_NB_state_sent2;
switchD_0011f043_caseD_0:
          sVar5 = _libssh2_channel_write
                            (session->scpSend_channel,0,session->scpSend_response,
                             session->scpSend_response_len);
          if ((int)sVar5 == -0x25) {
            pcVar8 = "Would block sending time data for SCP file";
            goto LAB_0011f375;
          }
          if ((int)sVar5 != (int)session->scpSend_response_len) {
            pcVar8 = "Unable to send time data for SCP file";
            goto LAB_0011f481;
          }
          session->scpSend_state = libssh2_NB_state_sent3;
switchD_0011f043_caseD_1:
          sVar5 = _libssh2_channel_read
                            (session->scpSend_channel,0,(char *)session->scpSend_response,1);
          iVar1 = (int)sVar5;
          if (iVar1 != -0x25) {
            if (iVar1 < 0) goto LAB_0011f2ac;
            if (iVar1 == 0) goto LAB_0011f3f4;
            if (session->scpSend_response[0] != '\0') {
              pcVar8 = "Invalid SCP ACK response";
              goto LAB_0011f40b;
            }
            goto switchD_0011f06a_caseD_0;
          }
LAB_0011f36e:
          pcVar8 = "Would block waiting for response";
        }
      }
    }
    else {
      if (iVar1 != -0x25) {
        (*session->free)(session->scpSend_command,&session->abstract);
        session->scpSend_command = (uchar *)0x0;
        pcVar8 = "Unknown error while getting error string";
LAB_0011f40b:
        iVar1 = -0x1c;
LAB_0011f411:
        _libssh2_error(session,iVar1,pcVar8);
        iVar1 = session->err_code;
        pcVar8 = session->err_msg;
        do {
          iVar2 = libssh2_channel_free(session->scpSend_channel);
        } while (iVar2 == -0x25);
        session->err_code = iVar1;
        session->err_msg = pcVar8;
        session->scpSend_channel = (LIBSSH2_CHANNEL *)0x0;
LAB_0011f449:
        session->scpSend_state = libssh2_NB_state_idle;
        return (LIBSSH2_CHANNEL *)0x0;
      }
      pcVar8 = "Would block requesting SCP startup";
    }
  }
LAB_0011f375:
  iVar1 = -0x25;
LAB_0011f377:
  _libssh2_error(session,iVar1,pcVar8);
  return (LIBSSH2_CHANNEL *)0x0;
}

Assistant:

static LIBSSH2_CHANNEL *
scp_send(LIBSSH2_SESSION * session, const char *path, int mode,
         libssh2_int64_t size, time_t mtime, time_t atime)
{
    size_t cmd_len;
    int rc;
    int tmp_err_code;
    const char *tmp_err_msg;

    if(session->scpSend_state == libssh2_NB_state_idle) {
        session->scpSend_command_len =
            _libssh2_shell_quotedsize(path) + sizeof("scp -t ") +
            ((mtime || atime) ? 1 : 0);

        session->scpSend_command =
            LIBSSH2_ALLOC(session, session->scpSend_command_len);

        if(!session->scpSend_command) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate a command buffer for "
                           "SCP session");
            return NULL;
        }

        snprintf((char *)session->scpSend_command,
                 session->scpSend_command_len,
                 "scp -%st ", (mtime || atime) ? "p" : "");

        cmd_len = strlen((char *)session->scpSend_command);

        if(!session->flag.quote_paths) {
            size_t path_len;

            path_len = strlen(path);

            /* no NUL-termination needed, so memcpy will do */
            memcpy(&session->scpSend_command[cmd_len], path, path_len);
            cmd_len += path_len;

        }
        else {
            cmd_len += shell_quotearg(path,
                                      &session->scpSend_command[cmd_len],
                                      session->scpSend_command_len - cmd_len);
        }

        /* the command to exec should _not_ be NUL-terminated */
        session->scpSend_command_len = cmd_len;

        _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                       "Opening channel for SCP send"));
        /* Allocate a channel */

        session->scpSend_state = libssh2_NB_state_created;
    }

    if(session->scpSend_state == libssh2_NB_state_created) {
        session->scpSend_channel =
            _libssh2_channel_open(session, "session", sizeof("session") - 1,
                                  LIBSSH2_CHANNEL_WINDOW_DEFAULT,
                                  LIBSSH2_CHANNEL_PACKET_DEFAULT, NULL, 0);
        if(!session->scpSend_channel) {
            if(libssh2_session_last_errno(session) != LIBSSH2_ERROR_EAGAIN) {
                /* previous call set libssh2_session_last_error(), pass it
                   through */
                LIBSSH2_FREE(session, session->scpSend_command);
                session->scpSend_command = NULL;
                session->scpSend_state = libssh2_NB_state_idle;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block starting up channel");
            }
            return NULL;
        }

        session->scpSend_state = libssh2_NB_state_sent;
    }

    if(session->scpSend_state == libssh2_NB_state_sent) {
        /* Request SCP for the desired file */
        rc = _libssh2_channel_process_startup(session->scpSend_channel, "exec",
                                              sizeof("exec") - 1,
                                              (char *)session->scpSend_command,
                                              session->scpSend_command_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block requesting SCP startup");
            return NULL;
        }
        else if(rc) {
            /* previous call set libssh2_session_last_error(), pass it
               through */
            LIBSSH2_FREE(session, session->scpSend_command);
            session->scpSend_command = NULL;
            _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                           "Unknown error while getting error string");
            goto scp_send_error;
        }
        LIBSSH2_FREE(session, session->scpSend_command);
        session->scpSend_command = NULL;

        session->scpSend_state = libssh2_NB_state_sent1;
    }

    if(session->scpSend_state == libssh2_NB_state_sent1) {
        /* Wait for ACK */
        rc = (int)_libssh2_channel_read(session->scpSend_channel, 0,
                                        (char *) session->scpSend_response, 1);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block waiting for response from remote");
            return NULL;
        }
        else if(rc < 0) {
            _libssh2_error(session, rc, "SCP failure");
            goto scp_send_error;
        }
        else if(!rc)
            /* remain in the same state */
            goto scp_send_empty_channel;
        else if(session->scpSend_response[0]) {
            _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                           "Invalid ACK response from remote");
            goto scp_send_error;
        }
        if(mtime || atime) {
            /* Send mtime and atime to be used for file */
            session->scpSend_response_len =
                snprintf((char *) session->scpSend_response,
                         LIBSSH2_SCP_RESPONSE_BUFLEN, "T%ld 0 %ld 0\n",
                         (long)mtime, (long)atime);
            _libssh2_debug((session, LIBSSH2_TRACE_SCP, "Sent %s",
                           session->scpSend_response));
        }

        session->scpSend_state = libssh2_NB_state_sent2;
    }

    /* Send mtime and atime to be used for file */
    if(mtime || atime) {
        if(session->scpSend_state == libssh2_NB_state_sent2) {
            rc = (int)_libssh2_channel_write(session->scpSend_channel, 0,
                                             session->scpSend_response,
                                             session->scpSend_response_len);
            if(rc == LIBSSH2_ERROR_EAGAIN) {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block sending time data for SCP file");
                return NULL;
            }
            else if(rc != (int)session->scpSend_response_len) {
                _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                               "Unable to send time data for SCP file");
                goto scp_send_error;
            }

            session->scpSend_state = libssh2_NB_state_sent3;
        }

        if(session->scpSend_state == libssh2_NB_state_sent3) {
            /* Wait for ACK */
            rc = (int)_libssh2_channel_read(session->scpSend_channel, 0,
                                            (char *) session->scpSend_response,
                                            1);
            if(rc == LIBSSH2_ERROR_EAGAIN) {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block waiting for response");
                return NULL;
            }
            else if(rc < 0) {
                _libssh2_error(session, rc, "SCP failure");
                goto scp_send_error;
            }
            else if(!rc)
                /* remain in the same state */
                goto scp_send_empty_channel;
            else if(session->scpSend_response[0]) {
                _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                               "Invalid SCP ACK response");
                goto scp_send_error;
            }

            session->scpSend_state = libssh2_NB_state_sent4;
        }
    }
    else {
        if(session->scpSend_state == libssh2_NB_state_sent2) {
            session->scpSend_state = libssh2_NB_state_sent4;
        }
    }

    if(session->scpSend_state == libssh2_NB_state_sent4) {
        /* Send mode, size, and basename */
        const char *base = strrchr(path, '/');
        if(base)
            base++;
        else
            base = path;

        session->scpSend_response_len =
            snprintf((char *) session->scpSend_response,
                     LIBSSH2_SCP_RESPONSE_BUFLEN, "C0%o %"
                     LIBSSH2_INT64_T_FORMAT " %s\n", mode,
                     size, base);
        _libssh2_debug((session, LIBSSH2_TRACE_SCP, "Sent %s",
                       session->scpSend_response));

        session->scpSend_state = libssh2_NB_state_sent5;
    }

    if(session->scpSend_state == libssh2_NB_state_sent5) {
        rc = (int)_libssh2_channel_write(session->scpSend_channel, 0,
                                         session->scpSend_response,
                                         session->scpSend_response_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block send core file data for SCP file");
            return NULL;
        }
        else if(rc != (int)session->scpSend_response_len) {
            _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                           "Unable to send core file data for SCP file");
            goto scp_send_error;
        }

        session->scpSend_state = libssh2_NB_state_sent6;
    }

    if(session->scpSend_state == libssh2_NB_state_sent6) {
        /* Wait for ACK */
        rc = (int)_libssh2_channel_read(session->scpSend_channel, 0,
                                        (char *) session->scpSend_response,
                                        1);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block waiting for response");
            return NULL;
        }
        else if(rc < 0) {
            _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                           "Invalid ACK response from remote");
            goto scp_send_error;
        }
        else if(rc == 0)
            goto scp_send_empty_channel;

        else if(session->scpSend_response[0]) {
            size_t err_len;
            char *err_msg;

            err_len =
                _libssh2_channel_packet_data_len(session->scpSend_channel, 0);
            err_msg = LIBSSH2_ALLOC(session, err_len + 1);
            if(!err_msg) {
                _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                               "failed to get memory");
                goto scp_send_error;
            }

            /* Read the remote error message */
            rc = (int)_libssh2_channel_read(session->scpSend_channel, 0,
                                            err_msg, err_len);
            if(rc > 0) {
                err_msg[err_len] = 0;
                _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                               "got %02x %s", session->scpSend_response[0],
                               err_msg));
            }
            LIBSSH2_FREE(session, err_msg);
            _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                           "failed to send file");
            goto scp_send_error;
        }
    }

    session->scpSend_state = libssh2_NB_state_idle;
    return session->scpSend_channel;

scp_send_empty_channel:
    /* the code only jumps here as a result of a zero read from channel_read()
       so we check EOF status to avoid getting stuck in a loop */
    if(libssh2_channel_eof(session->scpSend_channel)) {
        _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                       "Unexpected channel close");
    }
    else
        return session->scpSend_channel;
    /* fall-through */
scp_send_error:
    tmp_err_code = session->err_code;
    tmp_err_msg = session->err_msg;
    while(libssh2_channel_free(session->scpSend_channel) ==
          LIBSSH2_ERROR_EAGAIN);
    session->err_code = tmp_err_code;
    session->err_msg = tmp_err_msg;
    session->scpSend_channel = NULL;
    session->scpSend_state = libssh2_NB_state_idle;
    return NULL;
}